

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O1

Vec_Ptr_t * Llb_ManFlowCompute(Aig_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  Aig_Obj_t *pAVar5;
  long lVar6;
  
  Aig_ManCleanData(p);
  Aig_ManIncrementTravId(p);
  pVVar3 = p->vObjs;
  if (pVVar3->nSize < 1) {
    iVar4 = 0;
  }
  else {
    lVar6 = 0;
    iVar4 = 0;
    do {
      pvVar1 = pVVar3->pArray[lVar6];
      if ((pvVar1 != (void *)0x0) && ((*(ulong *)((long)pvVar1 + 0x18) & 0x20) != 0)) {
        if ((*(ulong *)((long)pvVar1 + 0x18) & 0x10) != 0) {
          __assert_fail("!pObj->fMarkA",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Flow.c"
                        ,0x34b,"Vec_Ptr_t *Llb_ManFlowCompute(Aig_Man_t *)");
        }
        pAVar5 = (Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe);
        if ((pAVar5->field_0x18 & 0x20) == 0) {
          iVar2 = Llb_ManFlowBwdPath2_rec(p,pAVar5);
          iVar4 = iVar4 + iVar2;
          if (iVar2 != 0) {
            Aig_ManIncrementTravId(p);
          }
        }
        if ((0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7) &&
           (pAVar5 = (Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe),
           (pAVar5->field_0x18 & 0x20) == 0)) {
          iVar2 = Llb_ManFlowBwdPath2_rec(p,pAVar5);
          iVar4 = iVar4 + iVar2;
          if (iVar2 != 0) {
            Aig_ManIncrementTravId(p);
          }
        }
      }
      lVar6 = lVar6 + 1;
      pVVar3 = p->vObjs;
    } while (lVar6 < pVVar3->nSize);
  }
  Aig_ManIncrementTravId(p);
  pVVar3 = p->vObjs;
  if (0 < pVVar3->nSize) {
    lVar6 = 0;
    do {
      pvVar1 = pVVar3->pArray[lVar6];
      if ((pvVar1 != (void *)0x0) && ((*(ulong *)((long)pvVar1 + 0x18) & 0x20) != 0)) {
        if ((*(ulong *)((long)pvVar1 + 0x18) & 0x10) != 0) {
          __assert_fail("!pObj->fMarkA",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Flow.c"
                        ,0x365,"Vec_Ptr_t *Llb_ManFlowCompute(Aig_Man_t *)");
        }
        pAVar5 = (Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe);
        if (((pAVar5->field_0x18 & 0x20) == 0) &&
           (iVar2 = Llb_ManFlowBwdPath2_rec(p,pAVar5), iVar2 != 0)) {
          __assert_fail("RetValue == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Flow.c"
                        ,0x369,"Vec_Ptr_t *Llb_ManFlowCompute(Aig_Man_t *)");
        }
        if (((0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7) &&
            (pAVar5 = (Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe),
            (pAVar5->field_0x18 & 0x20) == 0)) &&
           (iVar2 = Llb_ManFlowBwdPath2_rec(p,pAVar5), iVar2 != 0)) {
          __assert_fail("RetValue == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Flow.c"
                        ,0x36e,"Vec_Ptr_t *Llb_ManFlowCompute(Aig_Man_t *)");
        }
      }
      lVar6 = lVar6 + 1;
      pVVar3 = p->vObjs;
    } while (lVar6 < pVVar3->nSize);
  }
  pVVar3 = Llb_ManFlowMinCut(p);
  if (pVVar3->nSize != iVar4) {
    __assert_fail("Vec_PtrSize(vMinCut) == Flow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Flow.c"
                  ,0x373,"Vec_Ptr_t *Llb_ManFlowCompute(Aig_Man_t *)");
  }
  Llb_ManFlowUpdateCut(p,pVVar3);
  iVar4 = Llb_ManFlowVerifyCut(p,pVVar3);
  if (iVar4 == 0) {
    puts("Llb_ManFlow() error! The computed min-cut is not a cut!");
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Llb_ManFlowCompute( Aig_Man_t * p )
{
    Vec_Ptr_t * vMinCut;
    Aig_Obj_t * pObj;
    int Flow, FlowCur, RetValue, i;
    // find the max-flow
    Flow = 0;
    Aig_ManCleanData( p );
    Aig_ManIncrementTravId(p);
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !pObj->fMarkB )
            continue;
        assert( !pObj->fMarkA );
        if ( !Aig_ObjFanin0(pObj)->fMarkB )
        {
//printf( "%d ", Aig_ObjFanin0(pObj)->Id );
            FlowCur  = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin0(pObj) );
            Flow    += FlowCur;
            if ( FlowCur )
                Aig_ManIncrementTravId(p);
        }
        if ( Aig_ObjIsNode(pObj) && !Aig_ObjFanin1(pObj)->fMarkB )
        {
//printf( "%d ", Aig_ObjFanin1(pObj)->Id );
            FlowCur  = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin1(pObj) );
            Flow    += FlowCur;
            if ( FlowCur )
                Aig_ManIncrementTravId(p);
        }
    }
//printf( "\n" );

    // mark the nodes reachable from the latches
    Aig_ManIncrementTravId(p);
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !pObj->fMarkB )
            continue;
        assert( !pObj->fMarkA );
        if ( !Aig_ObjFanin0(pObj)->fMarkB )
        {
            RetValue = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin0(pObj) );
            assert( RetValue == 0 );
        }
        if ( Aig_ObjIsNode(pObj) && !Aig_ObjFanin1(pObj)->fMarkB )
        {
            RetValue = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin1(pObj) );
            assert( RetValue == 0 );
        }
    }
    // find the min-cut with the smallest volume
    vMinCut = Llb_ManFlowMinCut( p );
    assert( Vec_PtrSize(vMinCut) == Flow );
//printf( "%d ", Vec_PtrSize(vMinCut) );
    Llb_ManFlowUpdateCut( p, vMinCut );
//printf( "%d   ", Vec_PtrSize(vMinCut) );
    // verify the cut
    if ( !Llb_ManFlowVerifyCut(p, vMinCut) )
        printf( "Llb_ManFlow() error! The computed min-cut is not a cut!\n" );
//    Llb_ManFlowPrintCut( p, vMinCut );
    return vMinCut;
}